

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O2

int parsePseudoAttribute
              (ENCODING *enc,char *ptr,char *end,char **namePtr,char **nameEndPtr,char **valPtr,
              char **nextTokPtr)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  
  if (ptr != end) {
    uVar1 = toAscii(enc,ptr,end);
    if ((0x20 < uVar1) || ((0x100002600U >> ((ulong)uVar1 & 0x3f) & 1) == 0)) goto LAB_00450845;
    do {
      ptr = ptr + enc->minBytesPerChar;
      uVar1 = toAscii(enc,ptr,end);
      if (0x20 < uVar1) break;
    } while ((0x100002600U >> ((ulong)uVar1 & 0x3f) & 1) != 0);
    if (ptr != end) {
      *namePtr = ptr;
      do {
        iVar2 = toAscii(enc,ptr,end);
        uVar4 = (ulong)(iVar2 + 1U);
        if (iVar2 + 1U < 0x3f) {
          if ((0x200004c00U >> (uVar4 & 0x3f) & 1) != 0) {
            *nameEndPtr = ptr;
            goto LAB_00450760;
          }
          if (uVar4 == 0) goto LAB_0045084b;
          if (uVar4 == 0x3e) goto LAB_00450797;
        }
        ptr = ptr + enc->minBytesPerChar;
      } while( true );
    }
  }
  *namePtr = (char *)0x0;
  return 1;
LAB_00450797:
  *nameEndPtr = ptr;
  goto LAB_004507a4;
  while ((0x100002600U >> ((ulong)uVar1 & 0x3f) & 1) != 0) {
LAB_00450760:
    ptr = ptr + enc->minBytesPerChar;
    uVar1 = toAscii(enc,ptr,end);
    if (0x3d < uVar1) goto LAB_00450845;
  }
  if ((ulong)uVar1 != 0x3d) goto LAB_00450845;
LAB_004507a4:
  if (ptr != *namePtr) {
    do {
      ptr = ptr + enc->minBytesPerChar;
      uVar1 = toAscii(enc,ptr,end);
      if (0x27 < uVar1) goto LAB_0045084b;
    } while ((0x100002600U >> ((ulong)uVar1 & 0x3f) & 1) != 0);
    if ((0x8400000000U >> ((ulong)uVar1 & 0x3f) & 1) != 0) {
      ptr = ptr + enc->minBytesPerChar;
      *valPtr = ptr;
      while( true ) {
        uVar3 = toAscii(enc,ptr,end);
        if (uVar3 == uVar1) {
          *nextTokPtr = ptr + enc->minBytesPerChar;
          return 1;
        }
        if (((uVar3 - 0x3a < 0xfffffff6) && ((uVar3 & 0xffffffdf) - 0x5b < 0xffffffe6)) &&
           ((0x32 < uVar3 - 0x2d || ((0x4000000000003U >> ((ulong)(uVar3 - 0x2d) & 0x3f) & 1) == 0))
           )) break;
        ptr = ptr + enc->minBytesPerChar;
      }
    }
LAB_0045084b:
    *nextTokPtr = ptr;
    return 0;
  }
LAB_00450845:
  *nextTokPtr = ptr;
  return 0;
}

Assistant:

static int
parsePseudoAttribute(const ENCODING *enc,
                     const char *ptr,
                     const char *end,
                     const char **namePtr,
                     const char **nameEndPtr,
                     const char **valPtr,
                     const char **nextTokPtr)
{
  int c;
  char open;
  if (ptr == end) {
    *namePtr = NULL;
    return 1;
  }
  if (!isSpace(toAscii(enc, ptr, end))) {
    *nextTokPtr = ptr;
    return 0;
  }
  do {
    ptr += enc->minBytesPerChar;
  } while (isSpace(toAscii(enc, ptr, end)));
  if (ptr == end) {
    *namePtr = NULL;
    return 1;
  }
  *namePtr = ptr;
  for (;;) {
    c = toAscii(enc, ptr, end);
    if (c == -1) {
      *nextTokPtr = ptr;
      return 0;
    }
    if (c == ASCII_EQUALS) {
      *nameEndPtr = ptr;
      break;
    }
    if (isSpace(c)) {
      *nameEndPtr = ptr;
      do {
        ptr += enc->minBytesPerChar;
      } while (isSpace(c = toAscii(enc, ptr, end)));
      if (c != ASCII_EQUALS) {
        *nextTokPtr = ptr;
        return 0;
      }
      break;
    }
    ptr += enc->minBytesPerChar;
  }
  if (ptr == *namePtr) {
    *nextTokPtr = ptr;
    return 0;
  }
  ptr += enc->minBytesPerChar;
  c = toAscii(enc, ptr, end);
  while (isSpace(c)) {
    ptr += enc->minBytesPerChar;
    c = toAscii(enc, ptr, end);
  }
  if (c != ASCII_QUOT && c != ASCII_APOS) {
    *nextTokPtr = ptr;
    return 0;
  }
  open = (char)c;
  ptr += enc->minBytesPerChar;
  *valPtr = ptr;
  for (;; ptr += enc->minBytesPerChar) {
    c = toAscii(enc, ptr, end);
    if (c == open)
      break;
    if (!(ASCII_a <= c && c <= ASCII_z)
        && !(ASCII_A <= c && c <= ASCII_Z)
        && !(ASCII_0 <= c && c <= ASCII_9)
        && c != ASCII_PERIOD
        && c != ASCII_MINUS
        && c != ASCII_UNDERSCORE) {
      *nextTokPtr = ptr;
      return 0;
    }
  }
  *nextTokPtr = ptr + enc->minBytesPerChar;
  return 1;
}